

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O0

void __thiscall license::test::env_var_not_defined::test_method(env_var_not_defined *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  AuditEvent *pAVar4;
  basic_cstring<const_char> local_208;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]> local_1f8;
  assertion_result local_1d8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  size_type local_1a0;
  undefined4 local_194;
  basic_cstring<const_char> local_190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_180;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_118;
  assertion_result local_f8;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0 [2];
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  EventRegistry registry;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  env_var_not_defined *this_local;
  
  unsetenv("LICENSE_LOCATION");
  locate::LocatorFactory::find_license_near_module(false);
  locate::LocatorFactory::find_license_with_env_var(true);
  LicenseReader::LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(LicenseLocation *)0x0);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"PRODUCT",&local_a9);
  LicenseReader::readLicenses
            ((EventRegistry *)local_88,
             (LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a8,
             (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_d0,0x54,&local_e0);
    bVar2 = EventRegistry::isGood((EventRegistry *)local_88);
    boost::test_tools::assertion_result::assertion_result(&local_f8,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,"!registry.isGood()",0x12);
    boost::unit_test::operator<<(&local_118,plVar3,&local_128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_f8,&local_118,&local_138,0x54,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_118);
    boost::test_tools::assertion_result::~assertion_result(&local_f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_158);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_148,0x55,&local_158);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_180,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    local_194 = 0;
    local_1a0 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                size((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                     &registry.current_validation_step);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_180,&local_190,0x55,1,2,&local_194,"0",&local_1a0,"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pAVar4 = EventRegistry::getLastFailure((EventRegistry *)local_88);
  if (pAVar4 == (AuditEvent *)0x0) {
    __assert_fail("registry.getLastFailure() != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
                  ,0x56,"void license::test::env_var_not_defined::test_method()");
  }
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1b0,0x58,&local_1c0);
    pAVar4 = EventRegistry::getLastFailure((EventRegistry *)local_88);
    boost::test_tools::assertion_result::assertion_result
              (&local_1d8,pAVar4->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1f8,plVar3,(char (*) [18])"error as expected");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_1f8,&local_208,0x58,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>::
    ~lazy_ostream_impl(&local_1f8);
    boost::test_tools::assertion_result::~assertion_result(&local_1d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  EventRegistry::~EventRegistry((EventRegistry *)local_88);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  LicenseReader::~LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(env_var_not_defined) {
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
	locate::LocatorFactory::find_license_near_module(false);
	locate::LocatorFactory::find_license_with_env_var(true);
	LicenseReader licenseReader(nullptr);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT", licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_MESSAGE((ENVIRONMENT_VARIABLE_NOT_DEFINED == registry.getLastFailure()->event_type),
						"error as expected");
}